

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-hparams.cpp
# Opt level: O0

uint32_t __thiscall llama_hparams::n_embd_k_s(llama_hparams *this)

{
  int local_1c;
  llama_hparams *this_local;
  uint32_t local_4;
  
  if (this->wkv_head_size == 0) {
    if (this->ssm_d_conv == 0) {
      local_1c = 0;
    }
    else {
      local_1c = this->ssm_d_conv - 1;
    }
    local_4 = local_1c * this->ssm_d_inner;
  }
  else {
    local_4 = this->token_shift_count * this->n_embd;
  }
  return local_4;
}

Assistant:

uint32_t llama_hparams::n_embd_k_s() const {
    if (wkv_head_size != 0) {
        // for RWKV models
        return token_shift_count * n_embd;
    }

    // TODO: maybe support other convolution strides than 1
    // NOTE: since the first column of the conv_state is shifted out each time, it's not actually needed
    return (ssm_d_conv > 0 ? ssm_d_conv - 1 : 0) * ssm_d_inner;
}